

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall
cmMakefile::GetCustomCommandTarget
          (cmMakefile *this,string *target,cmObjectLibraryCommands objLibCommands,
          cmListFileBacktrace *lfbt)

{
  bool bVar1;
  PolicyStatus PVar2;
  TargetType TVar3;
  pointer ppVar4;
  ostream *poVar5;
  cmake *pcVar6;
  PolicyID id;
  string local_550;
  ostringstream local_530 [8];
  ostringstream e_2;
  string local_3b8;
  ostringstream local_398 [8];
  ostringstream e_1;
  cmTarget *t;
  cmTarget *local_1f8;
  cmTarget *t_1;
  undefined1 local_1c0 [8];
  ostringstream e;
  MessageType local_44;
  bool issueMessage;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  _Stack_40;
  MessageType messageType;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_38;
  iterator ti;
  cmListFileBacktrace *lfbt_local;
  cmObjectLibraryCommands objLibCommands_local;
  string *target_local;
  cmMakefile *this_local;
  
  ti.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
               )lfbt;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
       ::find(&this->Targets,target);
  _Stack_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
       ::end(&this->Targets);
  bVar1 = std::__detail::operator==(&local_38,&stack0xffffffffffffffc0);
  if (bVar1) {
    local_44 = AUTHOR_WARNING;
    bVar1 = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    PVar2 = GetPolicyStatus(this,CMP0040,false);
    if (PVar2 != OLD) {
      if (PVar2 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&t_1,(cmPolicies *)0x28,id);
        poVar5 = std::operator<<((ostream *)local_1c0,(string *)&t_1);
        std::operator<<(poVar5,"\n");
        std::__cxx11::string::~string((string *)&t_1);
        bVar1 = true;
      }
      else if (PVar2 - NEW < 3) {
        bVar1 = true;
        local_44 = FATAL_ERROR;
      }
    }
    if (bVar1) {
      local_1f8 = FindTargetToUse(this,target,false);
      if (local_1f8 == (cmTarget *)0x0) {
        poVar5 = std::operator<<((ostream *)local_1c0,"No TARGET \'");
        poVar5 = std::operator<<(poVar5,(string *)target);
        std::operator<<(poVar5,"\' has been created in this directory.");
      }
      else {
        bVar1 = cmTarget::IsImported(local_1f8);
        if (bVar1) {
          poVar5 = std::operator<<((ostream *)local_1c0,"TARGET \'");
          poVar5 = std::operator<<(poVar5,(string *)target);
          std::operator<<(poVar5,"\' is IMPORTED and does not build here.");
        }
        else {
          poVar5 = std::operator<<((ostream *)local_1c0,"TARGET \'");
          poVar5 = std::operator<<(poVar5,(string *)target);
          std::operator<<(poVar5,"\' was not created in this directory.");
        }
      }
      pcVar6 = GetCMakeInstance(this);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(pcVar6,local_44,(string *)&t,
                          (cmListFileBacktrace *)
                          ti.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                          ._M_cur);
      std::__cxx11::string::~string((string *)&t);
    }
    this_local = (cmMakefile *)0x0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  }
  else {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                           *)&local_38);
    this_local = (cmMakefile *)&ppVar4->second;
    if ((objLibCommands == Reject) &&
       (TVar3 = cmTarget::GetType((cmTarget *)this_local), TVar3 == OBJECT_LIBRARY)) {
      std::__cxx11::ostringstream::ostringstream(local_398);
      poVar5 = std::operator<<((ostream *)local_398,"Target \"");
      poVar5 = std::operator<<(poVar5,(string *)target);
      std::operator<<(poVar5,
                      "\" is an OBJECT library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                     );
      pcVar6 = GetCMakeInstance(this);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(pcVar6,FATAL_ERROR,&local_3b8,
                          (cmListFileBacktrace *)
                          ti.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                          ._M_cur);
      std::__cxx11::string::~string((string *)&local_3b8);
      this_local = (cmMakefile *)0x0;
      std::__cxx11::ostringstream::~ostringstream(local_398);
    }
    else {
      TVar3 = cmTarget::GetType((cmTarget *)this_local);
      if (TVar3 == INTERFACE_LIBRARY) {
        std::__cxx11::ostringstream::ostringstream(local_530);
        poVar5 = std::operator<<((ostream *)local_530,"Target \"");
        poVar5 = std::operator<<(poVar5,(string *)target);
        std::operator<<(poVar5,
                        "\" is an INTERFACE library that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands."
                       );
        pcVar6 = GetCMakeInstance(this);
        std::__cxx11::ostringstream::str();
        cmake::IssueMessage(pcVar6,FATAL_ERROR,&local_550,
                            (cmListFileBacktrace *)
                            ti.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                            ._M_cur);
        std::__cxx11::string::~string((string *)&local_550);
        this_local = (cmMakefile *)0x0;
        std::__cxx11::ostringstream::~ostringstream(local_530);
      }
    }
  }
  return (cmTarget *)this_local;
}

Assistant:

cmTarget* cmMakefile::GetCustomCommandTarget(
  const std::string& target, cmObjectLibraryCommands objLibCommands,
  const cmListFileBacktrace& lfbt) const
{
  // Find the target to which to add the custom command.
  auto ti = this->Targets.find(target);

  if (ti == this->Targets.end()) {
    MessageType messageType = MessageType::AUTHOR_WARNING;
    bool issueMessage = false;
    std::ostringstream e;
    switch (this->GetPolicyStatus(cmPolicies::CMP0040)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0040) << "\n";
        issueMessage = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      if (cmTarget const* t = this->FindTargetToUse(target)) {
        if (t->IsImported()) {
          e << "TARGET '" << target
            << "' is IMPORTED and does not build here.";
        } else {
          e << "TARGET '" << target << "' was not created in this directory.";
        }
      } else {
        e << "No TARGET '" << target
          << "' has been created in this directory.";
      }
      this->GetCMakeInstance()->IssueMessage(messageType, e.str(), lfbt);
    }

    return nullptr;
  }

  cmTarget* t = &ti->second;
  if (objLibCommands == cmObjectLibraryCommands::Reject &&
      t->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an OBJECT library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           lfbt);
    return nullptr;
  }
  if (t->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    std::ostringstream e;
    e << "Target \"" << target
      << "\" is an INTERFACE library "
         "that may not have PRE_BUILD, PRE_LINK, or POST_BUILD commands.";
    this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR, e.str(),
                                           lfbt);
    return nullptr;
  }

  return t;
}